

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_lrzip.c
# Opt level: O2

void test_read_filter_lrzip(void)

{
  wchar_t wVar1;
  int iVar2;
  archive_conflict *a;
  char *v2;
  char *pcVar3;
  undefined **ppuVar4;
  ulong uVar5;
  archive_entry *ae;
  
  wVar1 = canLrzip();
  if (wVar1 != L'\0') {
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                     ,L'*',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_support_filter_lrzip((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L'+',-0x14,"ARCHIVE_WARN",(long)iVar2,
                        "archive_read_support_filter_lrzip(a)",a);
    iVar2 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L',',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",a);
    extract_reference_file("test_read_filter_lrzip.tar.lrz");
    wVar1 = archive_read_open_filename(a,"test_read_filter_lrzip.tar.lrz",200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L'/',0,"ARCHIVE_OK",(long)wVar1,"archive_read_open_filename(a, name, 200)",
                        a);
    ppuVar4 = &PTR_anon_var_dwarf_584e7_0030cfd0;
    for (uVar5 = 0; uVar5 != 7; uVar5 = uVar5 + 1) {
      pcVar3 = *ppuVar4;
      failure("Could not read file %d (%s) from %s",uVar5 & 0xffffffff,pcVar3,
              "test_read_filter_lrzip.tar.lrz");
      iVar2 = archive_read_next_header((archive *)a,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                          ,L'5',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
      v2 = archive_entry_pathname(ae);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                 ,L'6',pcVar3,"n[i]",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      ppuVar4 = ppuVar4 + 1;
    }
    iVar2 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L':',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    iVar2 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L'=',(long)iVar2,"archive_filter_code(a, 0)",10,"ARCHIVE_FILTER_LRZIP",
                        (void *)0x0);
    pcVar3 = archive_filter_name((archive *)a,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
               ,L'>',pcVar3,"archive_filter_name(a, 0)","lrzip","\"lrzip\"",(void *)0x0,L'\0');
    iVar2 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L'?',(long)iVar2,"archive_format(a)",0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",
                        (void *)0x0);
    iVar2 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L'A',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",(void *)0x0);
    iVar2 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                        ,L'B',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_lrzip.c"
                 ,L'&');
  test_skipping("lrzip command-line program not found");
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_lrzip)
{
	const char *name = "test_read_filter_lrzip.tar.lrz";
	/* lrzip tracks directories as files, ensure that we list everything */
	const char *n[] = {
		"d1/", "d1/f1", "d1/f2", "d1/f3", "f1", "f2", "f3", NULL };
	struct archive_entry *ae;
	struct archive *a;
	int i;

	if (!canLrzip()) {
		skipping("lrzip command-line program not found");
		return;
	}

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_support_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, name, 200));

	/* Read entries, match up names with list above. */
	for (i = 0; i < 7; ++i) {
		failure("Could not read file %d (%s) from %s", i, n[i], name);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		assertEqualString(n[i], archive_entry_pathname(ae));
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LRZIP);
	assertEqualString(archive_filter_name(a, 0), "lrzip");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_GNUTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}